

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

GaoVectorSet * __thiscall
AlphaVectorPlanning::BackProjectSparse
          (GaoVectorSet *__return_storage_ptr__,AlphaVectorPlanning *this,VectorSet *v)

{
  int iVar1;
  size_type sVar2;
  uint uVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  size_t sVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar6;
  double *__dest;
  E *this_00;
  ulong uVar7;
  ulong uVar8;
  pointer pcVar9;
  long lVar10;
  size_type sVar11;
  value_type vVar12;
  VectorSet v1;
  vector<int,_std::allocator<int>_> duplicates;
  ulong local_f8;
  int local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  double *local_c8;
  ulong local_c0;
  GaoVectorSet *local_b8;
  size_type local_b0;
  string local_a8;
  size_type local_88;
  size_type sStack_80;
  new_allocator<double> local_78 [8];
  size_type local_70;
  double *local_68;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  pPVar4 = this->_m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->_m_puShared).px;
  }
  uVar3 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar4 = this->_m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->_m_puShared).px;
  }
  local_c0 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  pPVar4 = this->_m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->_m_puShared).px;
  }
  sVar5 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar4->super_PlanningUnitMADPDiscrete);
  local_b0 = v->size1_;
  if ((int)local_b0 == 0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "AlphaVectorPlanning::BackProjectSparse attempting to backproject empty value function");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"BackProjectSparse","");
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)local_e8);
  pcVar9 = (pointer)(local_b0 & 0xffffffff);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,aStack_d8._M_allocated_capacity + 1);
  }
  local_e8._8_8_ = ZEXT48(uVar3);
  aStack_d8._8_8_ = local_c0 & 0xffffffff;
  local_e8._0_8_ = (pointer)0x0;
  aStack_d8._M_allocated_capacity = 0;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(__return_storage_ptr__,(extent_gen<2UL> *)local_e8);
  local_e8._8_8_ = sVar5 & 0xffffffff;
  aStack_d8._8_8_ = (long)pcVar9 * local_e8._8_8_;
  local_e8._0_8_ = pcVar9;
  if (aStack_d8._8_8_ == 0) {
    local_c8 = (double *)0x0;
  }
  else {
    local_c8 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)(local_e8 + 0x10),aStack_d8._8_8_,(void *)0x0);
  }
  local_88 = v->size1_;
  sStack_80 = v->size2_;
  local_70 = (v->data_).size_;
  if (local_70 == 0) {
    local_68 = (double *)0x0;
  }
  else {
    local_68 = __gnu_cxx::new_allocator<double>::allocate(local_78,local_70,(void *)0x0);
    sVar2 = (v->data_).size_;
    if (sVar2 != 0) {
      memmove(local_68,(v->data_).data_,sVar2 << 3);
    }
  }
  GetDuplicateIndices(&local_48,v);
  if (uVar3 != 0) {
    local_50 = local_c0 & 0xffffffff;
    local_58 = (ulong)uVar3;
    local_f8 = 0;
    local_b8 = __return_storage_ptr__;
    do {
      if ((int)local_c0 != 0) {
        uVar8 = 0;
        do {
          lVar10 = 0;
          sVar11 = 0;
          do {
            iVar1 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar11];
            local_f0 = (int)sVar5;
            if ((long)iVar1 == -1) {
              if (local_f0 != 0) {
                uVar7 = 0;
                do {
                  local_a8._M_dataplus._M_p =
                       *(pointer *)
                        (*(long *)(*(long *)&(this->_m_TsOsForBackup).
                                             super__Vector_base<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>,_std::allocator<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[local_f8].
                                             super__Vector_base<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar7 * 0x18) +
                        uVar8 * 8);
                  local_a8._M_string_length = (size_type)&local_88;
                  local_a8.field_2._M_allocated_capacity = sVar11;
                  vVar12 = boost::numeric::ublas::
                           vector_scalar_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::vector_inner_prod<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_double>_>
                           ::evaluate((vector_scalar_binary<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::vector_inner_prod<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_double>_>
                                       *)&local_a8);
                  local_c8[local_e8._8_8_ * sVar11 + uVar7] = vVar12;
                  uVar7 = uVar7 + 1;
                } while (uVar7 != (sVar5 & 0xffffffff));
              }
            }
            else if (local_f0 != 0) {
              uVar7 = 0;
              do {
                *(double *)((long)local_c8 + uVar7 * 8 + local_e8._8_8_ * lVar10) =
                     local_c8[(long)iVar1 * local_e8._8_8_ + uVar7];
                uVar7 = uVar7 + 1;
              } while ((sVar5 & 0xffffffff) != uVar7);
            }
            sVar11 = sVar11 + 1;
            lVar10 = lVar10 + 8;
          } while ((int)sVar11 != (int)local_b0);
          pmVar6 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)operator_new(0x28);
          __return_storage_ptr__ = local_b8;
          pmVar6->size1_ = local_e8._0_8_;
          pmVar6->size2_ = local_e8._8_8_;
          (pmVar6->data_).size_ = aStack_d8._8_8_;
          if (aStack_d8._8_8_ == 0) {
            (pmVar6->data_).data_ = (pointer)0x0;
          }
          else {
            __dest = __gnu_cxx::new_allocator<double>::allocate
                               ((new_allocator<double> *)&pmVar6->data_,aStack_d8._8_8_,(void *)0x0)
            ;
            (pmVar6->data_).data_ = __dest;
            if (aStack_d8._8_8_ != 0) {
              memmove(__dest,local_c8,aStack_d8._8_8_ << 3);
            }
          }
          (__return_storage_ptr__->
          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
          ).
          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
          .base_[(__return_storage_ptr__->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .origin_offset_ +
                 (__return_storage_ptr__->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .stride_list_.elems[0] * local_f8 +
                 (__return_storage_ptr__->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .stride_list_.elems[1] * uVar8] = pmVar6;
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_50);
      }
      local_f8 = local_f8 + 1;
    } while (local_f8 != local_58);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"BackProjectSparse","");
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70 != 0) {
    operator_delete(local_68,local_70 << 3);
  }
  if (aStack_d8._8_8_ != 0) {
    operator_delete(local_c8,aStack_d8._8_8_ << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

GaoVectorSet AlphaVectorPlanning::BackProjectSparse(const VectorSet &v) const
{
    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates(),
        nrInV=v.size1();

    if(nrInV==0)
        throw(E("AlphaVectorPlanning::BackProjectSparse attempting to backproject empty value function"));

    StartTimer("BackProjectSparse");
    
    GaoVectorSet G(boost::extents[nrA][nrO]);
    VectorSet v1(nrInV,nrS);
    VectorSet vv=v;
    double x;

#if AlphaVectorPlanning_CheckForDuplicates
    vector<int> duplicates=GetDuplicateIndices(v);
#else
    vector<int> duplicates(nrInV,-1);
#endif
    int dup;

    using namespace boost::numeric::ublas;

    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
#if !AlphaVectorPlanning_UseFastSparseBackup
            matrix_column<const ObservationModelMappingSparse::SparseMatrix>
                mO(*_m_Os[a],o);
#endif
            for(unsigned int k=0;k!=nrInV;k++)
            {
                if(duplicates[k]==-1)
                {
                    const matrix_row<VectorSet> mV(vv,k);

                    for(unsigned int s=0;s!=nrS;s++)
                    {
#if AlphaVectorPlanning_UseFastSparseBackup
                        x=inner_prod(*_m_TsOsForBackup[a][s][o],mV);
#else
                        matrix_row<const TransitionModelMappingSparse::
                            SparseMatrix> mT(*_m_Ts[a],s);
                        x=inner_prod(element_prod(mT,mO),mV);
#endif
                        v1(k,s)=x;
                    }
                }
                else
                {
                    dup=duplicates[k];
                    for(unsigned int s=0;s!=nrS;s++)
                        v1(k,s)=v1(dup,s);
                }
            }
            G[a][o]=new VectorSet(v1);
        }

    StopTimer("BackProjectSparse");

    return(G);
}